

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::ruby::DefaultValueForField_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,FieldDescriptor *field)

{
  long lVar1;
  long lVar2;
  CppType CVar3;
  Type TVar4;
  EnumValueDescriptor *pEVar5;
  ostream *poVar6;
  ostream *this_00;
  byte *pbVar7;
  int value;
  char *pcVar8;
  int i;
  ulong uVar9;
  string default_str;
  ostringstream os;
  char *local_1d0;
  string local_1c8 [8];
  ulong local_1c0;
  long local_1a8 [28];
  undefined1 auStack_c8 [152];
  
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  switch(CVar3) {
  case CPPTYPE_INT32:
    value = *(int *)(this + 0x40);
    goto LAB_002c7ed5;
  case CPPTYPE_INT64:
    NumberToString<long>(__return_storage_ptr__,*(long *)(this + 0x40));
    break;
  case CPPTYPE_UINT32:
    NumberToString<unsigned_int>(__return_storage_ptr__,*(uint *)(this + 0x40));
    break;
  case CPPTYPE_UINT64:
    NumberToString<unsigned_long>(__return_storage_ptr__,*(unsigned_long *)(this + 0x40));
    break;
  case CPPTYPE_DOUBLE:
    NumberToString<double>(__return_storage_ptr__,*(double *)(this + 0x40));
    break;
  case CPPTYPE_FLOAT:
    NumberToString<float>(__return_storage_ptr__,*(float *)(this + 0x40));
    break;
  case CPPTYPE_BOOL:
    pcVar8 = "false";
    if (this[0x40] != (ruby)0x0) {
      pcVar8 = "true";
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar8,(allocator *)local_1a8);
    break;
  case CPPTYPE_ENUM:
    pEVar5 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    value = *(int *)(pEVar5 + 4);
LAB_002c7ed5:
    NumberToString<int>(__return_storage_ptr__,value);
    break;
  case CPPTYPE_STRING:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__cxx11::string::string(local_1c8,*(string **)(this + 0x40));
    TVar4 = FieldDescriptor::type((FieldDescriptor *)this);
    if (TVar4 == TYPE_STRING) {
      local_1d0 = "\"";
      poVar6 = std::operator<<((ostream *)local_1a8,"\"");
      poVar6 = std::operator<<(poVar6,local_1c8);
LAB_002c7f7a:
      std::operator<<(poVar6,local_1d0);
    }
    else {
      TVar4 = FieldDescriptor::type((FieldDescriptor *)this);
      if (TVar4 == TYPE_BYTES) {
        poVar6 = (ostream *)local_1a8;
        std::operator<<(poVar6,"\"");
        lVar1 = *(long *)(local_1a8[0] + -0x18);
        std::ios::fill();
        auStack_c8[lVar1] = 0x30;
        local_1d0 = "\".force_encoding(\"ASCII-8BIT\")";
        for (uVar9 = 0; uVar9 < local_1c0; uVar9 = uVar9 + 1) {
          this_00 = std::operator<<(poVar6,"\\x");
          lVar1 = *(long *)this_00;
          lVar2 = *(long *)(lVar1 + -0x18);
          *(uint *)(this_00 + lVar2 + 0x18) = *(uint *)(this_00 + lVar2 + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(this_00 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
          pbVar7 = (byte *)std::__cxx11::string::at((ulong)local_1c8);
          std::ostream::operator<<(this_00,(ushort)*pbVar7);
        }
        goto LAB_002c7f7a;
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                  ,0xa8,
                  "std::string google::protobuf::compiler::ruby::DefaultValueForField(const FieldDescriptor *)"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValueForField(const FieldDescriptor* field) {
  switch(field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return NumberToString(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_INT64:
      return NumberToString(field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT32:
      return NumberToString(field->default_value_uint32());
    case FieldDescriptor::CPPTYPE_UINT64:
      return NumberToString(field->default_value_uint64());
    case FieldDescriptor::CPPTYPE_FLOAT:
      return NumberToString(field->default_value_float());
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return NumberToString(field->default_value_double());
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      return NumberToString(field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_STRING: {
      std::ostringstream os;
      std::string default_str = field->default_value_string();

      if (field->type() == FieldDescriptor::TYPE_STRING) {
        os << "\"" << default_str << "\"";
      } else if (field->type() == FieldDescriptor::TYPE_BYTES) {
        os << "\"";

        os.fill('0');
        for (int i = 0; i < default_str.length(); ++i) {
          // Write the hex form of each byte.
          os << "\\x" << std::hex << std::setw(2)
             << ((uint16)((unsigned char)default_str.at(i)));
        }
        os << "\".force_encoding(\"ASCII-8BIT\")";
      }

      return os.str();
    }
    default: assert(false); return "";
  }
}